

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSetInner::IsEqualTo(CharSetInner *this,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint local_34;
  uint i;
  CharSetInner *otherInner;
  CharSetNode *other_local;
  uint level_local;
  CharSetInner *this_local;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x26b,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((other == (CharSetNode *)0x0) ||
     (uVar3 = (*other->_vptr_CharSetNode[0xd])(), (uVar3 & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x26c,"(other != nullptr && !other->IsLeaf())",
                       "other != nullptr && !other->IsLeaf()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (other == (CharSetNode *)&CharSetFull::Instance) {
    this_local._7_1_ = false;
  }
  else {
    for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
      if (this->children[local_34] != (CharSetNode *)0x0) {
        if (other[(ulong)local_34 + 1]._vptr_CharSetNode == (_func_int **)0x0) {
          return false;
        }
        uVar3 = (*this->children[local_34]->_vptr_CharSetNode[9])
                          (this->children[local_34],(ulong)(level - 1),
                           other[(ulong)local_34 + 1]._vptr_CharSetNode);
        if ((uVar3 & 1) != 0) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CharSetInner::IsEqualTo(uint level, const CharSetNode* other) const
    {
        Assert(level > 0);
        Assert(other != nullptr && !other->IsLeaf());
        if (other == CharSetFull::TheFullNode)
            return false;
        level--;
        const CharSetInner* otherInner = (CharSetInner*)other;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != 0)
            {
                if (otherInner->children[i] == nullptr)
                    return false;
                if (children[i]->IsSubsetOf(level, otherInner->children[i]))
                    return false;
            }
        }
        return true;
    }